

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  XmlEncode local_48;
  string *local_20;
  string *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  local_20 = attribute;
  attribute_local = name;
  name_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = std::operator<<(this->m_os,' ');
      poVar2 = std::operator<<(poVar2,(string *)attribute_local);
      poVar2 = std::operator<<(poVar2,"=\"");
      XmlEncode::XmlEncode(&local_48,local_20,ForAttributes);
      poVar2 = Catch::operator<<(poVar2,&local_48);
      std::operator<<(poVar2,'\"');
      XmlEncode::~XmlEncode(&local_48);
    }
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, std::string const& attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }